

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O2

void __thiscall WorkerThread::~WorkerThread(WorkerThread *this)

{
  stopWorker(this);
  if ((this->workerThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&this->taskCV);
  std::packaged_task<void_()>::~packaged_task(&this->task);
  std::thread::~thread(&this->workerThread);
  return;
}

Assistant:

WorkerThread::~WorkerThread () {
	stopWorker ();

	if (workerThread.joinable ())
		workerThread.join ();
}